

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_mono_asio_channel_select.c
# Opt level: O1

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  bool bVar1;
  unsigned_long uVar2;
  int iVar3;
  float *out;
  int iVar4;
  
  if (framesPerBuffer != 0) {
    iVar3 = *(int *)((long)userData + 800);
    uVar2 = 0;
    do {
      *(undefined4 *)((long)outputBuffer + uVar2 * 4) =
           *(undefined4 *)((long)userData + (long)iVar3 * 4);
      iVar4 = iVar3 + 1;
      bVar1 = iVar3 < 199;
      iVar3 = iVar3 + -199;
      if (bVar1) {
        iVar3 = iVar4;
      }
      uVar2 = uVar2 + 1;
    } while (framesPerBuffer != uVar2);
    *(int *)((long)userData + 800) = iVar3;
  }
  return 0;
}

Assistant:

static int patestCallback( const void *inputBuffer, void *outputBuffer,
                            unsigned long framesPerBuffer,
                            const PaStreamCallbackTimeInfo* timeInfo,
                            PaStreamCallbackFlags statusFlags,
                            void *userData )
{
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    unsigned long i;
    int finished = 0;
    /* avoid unused variable warnings */
    (void) inputBuffer;
    (void) timeInfo;
    (void) statusFlags;
    for( i=0; i<framesPerBuffer; i++ )
    {
        *out++ = data->sine[data->phase];  /* left */
        data->phase += 1;
        if( data->phase >= TABLE_SIZE ) data->phase -= TABLE_SIZE;
    }
    return finished;
}